

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.c
# Opt level: O2

void converter_perror(char *spec)

{
  char *str;
  
  perr(spec);
  perr("\n");
  if (errnum != CONVERTER_ERROR_VOID) {
    if (errnum == CONVERTER_ERROR_NODICT) {
      str = "No dictionary loaded";
    }
    else {
      str = "Output buffer not enough for one segment";
    }
    perr(str);
    return;
  }
  return;
}

Assistant:

void converter_perror(const char * spec)
{
	perr(spec);
	perr("\n");
	switch(errnum)
	{
	case CONVERTER_ERROR_VOID:
		break;
	case CONVERTER_ERROR_NODICT:
		perr(_("No dictionary loaded"));
		break;
	case CONVERTER_ERROR_OUTBUF:
		perr(_("Output buffer not enough for one segment"));
		break;
	default:
		perr(_("Unknown"));
	}
}